

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *value)

{
  IRContext *this_00;
  DefUseManager *this_01;
  undefined8 *puVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  undefined8 *puVar5;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> work_list;
  undefined8 *local_78;
  undefined8 *puStack_70;
  long local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  if (value->opcode_ != OpLoad) {
    __assert_fail("value->opcode() == spv::Op::OpLoad",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x195,
                  "bool spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue(Instruction *, Instruction *)"
                 );
  }
  uVar3 = (value->has_result_id_ & 1) + 1;
  if (value->has_type_id_ == false) {
    uVar3 = (uint)value->has_result_id_;
  }
  uVar3 = Instruction::GetSingleWordOperand(value,uVar3);
  uVar4 = 0;
  if (var->has_result_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  if (uVar3 != uVar4) {
    __assert_fail("value->GetSingleWordInOperand(0) == var->result_id()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x196,
                  "bool spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue(Instruction *, Instruction *)"
                 );
  }
  local_78 = (undefined8 *)0x0;
  puStack_70 = (undefined8 *)0x0;
  local_68 = 0;
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_00);
  }
  this_01 = (this_00->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar3 = 0;
  if (value->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(value,(uint)value->has_type_id_);
  }
  pcStack_40 = std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp:409:27)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp:409:27)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  local_58._8_8_ = &local_78;
  bVar2 = analysis::DefUseManager::WhileEachUser
                    (this_01,uVar3,(function<bool_(spvtools::opt::Instruction_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  puVar1 = puStack_70;
  puVar5 = local_78;
  if (bVar2) {
    for (; puVar5 != puVar1; puVar5 = puVar5 + 1) {
      bVar2 = ReplaceCompositeExtract(this,var,(Instruction *)*puVar5);
      if (!bVar2) goto LAB_005649a9;
    }
    IRContext::KillInst((this->super_Pass).context_,value);
    bVar2 = true;
  }
  else {
LAB_005649a9:
    bVar2 = false;
  }
  if (local_78 != (undefined8 *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return bVar2;
}

Assistant:

bool DescriptorScalarReplacement::ReplaceLoadedValue(Instruction* var,
                                                     Instruction* value) {
  // |var| is the global variable that has to be eliminated (OpVariable).
  // |value| is the OpLoad instruction that has loaded |var|.
  // The function expects all users of |value| to be OpCompositeExtract
  // instructions. Otherwise the function returns false with an error message.
  assert(value->opcode() == spv::Op::OpLoad);
  assert(value->GetSingleWordInOperand(0) == var->result_id());
  std::vector<Instruction*> work_list;
  bool failed = !get_def_use_mgr()->WhileEachUser(
      value->result_id(), [this, &work_list](Instruction* use) {
        if (use->opcode() != spv::Op::OpCompositeExtract) {
          context()->EmitErrorMessage(
              "Variable cannot be replaced: invalid instruction", use);
          return false;
        }
        work_list.push_back(use);
        return true;
      });

  if (failed) {
    return false;
  }

  for (Instruction* use : work_list) {
    if (!ReplaceCompositeExtract(var, use)) {
      return false;
    }
  }

  // All usages of the loaded value have been killed. We can kill the OpLoad.
  context()->KillInst(value);
  return true;
}